

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O2

void deqp::gles2::Performance::writeLoopWorkload
               (ostringstream *stream,char *resultName,char *operandName)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  poVar1 = std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,resultName);
  std::operator<<(poVar1," = ");
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      if (iVar2 == 8) {
        std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,";");
        return;
      }
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>," * ");
    }
    poVar1 = std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"(");
    poVar1 = std::operator<<(poVar1,resultName);
    poVar1 = std::operator<<(poVar1," + ");
    poVar1 = std::operator<<(poVar1,operandName);
    std::operator<<(poVar1,")");
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static void writeLoopWorkload (std::ostringstream& stream, const char* resultName, const char* operandName)
{
	const int numMultiplications = 8;

	stream << resultName << " = ";

	for (int i = 0; i < numMultiplications; i++)
	{
		if (i > 0)
			stream << " * ";

		stream << "(" << resultName << " + " << operandName << ")";
	}

	stream << ";";
}